

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::Deconvolution_x86_avx::create_pipeline(Deconvolution_x86_avx *this,Option *opt)

{
  long *plVar1;
  int *piVar2;
  ulong uVar3;
  Layer *pLVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long in_RDI;
  float *k00_1;
  int j;
  int i_2;
  int k_2;
  int p_2;
  float *g00_1;
  int q_1;
  Mat weight_data_r2_1;
  int k_1;
  int i_1;
  float *p_1;
  float *pt;
  Mat weight_data_transposed;
  Mat weights [1];
  float *k00;
  int i;
  int k;
  int q;
  float *g00;
  int p;
  Mat weight_data_r2;
  Mat tmp;
  ParamDict pd;
  int maxk_1;
  int out_elempack;
  int elempack;
  int num_input;
  int maxk;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  ParamDict *in_stack_fffffffffffff700;
  Allocator *in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff710;
  int in_stack_fffffffffffff714;
  int in_stack_fffffffffffff718;
  int in_stack_fffffffffffff71c;
  Mat *in_stack_fffffffffffff720;
  int _c;
  Allocator *pAVar6;
  undefined8 in_stack_fffffffffffff728;
  void **ppvVar7;
  Mat *in_stack_fffffffffffff730;
  Option *in_stack_fffffffffffff7b0;
  Mat *in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7c4;
  void **local_810;
  Allocator *in_stack_fffffffffffff810;
  undefined8 in_stack_fffffffffffff818;
  int _c_00;
  undefined8 in_stack_fffffffffffff820;
  Mat *in_stack_fffffffffffff828;
  int local_788;
  int local_784;
  undefined8 local_778;
  undefined8 local_770;
  undefined4 local_750;
  undefined4 local_744;
  undefined8 local_738;
  void *local_730;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined4 local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined8 local_6d8;
  undefined4 *local_6d0;
  int local_6c4;
  void *local_6c0;
  int *local_6b8;
  long local_6b0;
  long *local_6a0;
  int local_694;
  int local_690;
  long local_680;
  int local_678;
  int local_674;
  long local_670;
  _func_int **local_668;
  Allocator local_660;
  int *local_658;
  undefined8 local_650;
  undefined4 local_648;
  long *local_640;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined8 local_620;
  undefined1 local_618 [16];
  void *local_608;
  int *local_600;
  void *local_5f8;
  undefined4 local_5f0;
  long *local_5e8;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  void *local_5c8;
  void *pvStack_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a8;
  undefined4 local_5a0;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined8 local_578;
  void *local_570;
  int local_564;
  int local_560;
  int local_55c;
  undefined4 *local_558;
  int local_54c;
  void *local_548;
  int *local_540;
  long local_538;
  undefined4 local_530;
  long *local_528;
  undefined4 local_520;
  int local_51c;
  int local_518;
  undefined4 local_514;
  undefined4 local_510;
  long local_508;
  void *local_500;
  int *local_4f8;
  long local_4f0;
  undefined4 local_4e8;
  long *local_4e0;
  undefined4 local_4d8;
  int local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined8 local_4c0;
  ParamDict local_4a8;
  int local_494;
  int local_490;
  int local_48c;
  int local_488;
  int local_484;
  byte *local_480;
  void **local_468;
  void **local_460;
  int local_454;
  undefined8 *local_450;
  int local_444;
  undefined8 *local_440;
  int local_434;
  void **local_430;
  undefined1 local_425;
  int local_424;
  void **local_420;
  undefined8 *local_418;
  undefined1 local_40d;
  int local_40c;
  long *local_408;
  undefined8 *local_400;
  undefined1 local_3f5;
  int local_3f4;
  void **local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3c8;
  void **local_3b8;
  void **local_3a0;
  void **local_390;
  undefined8 *local_380;
  undefined8 *local_370;
  void **local_360;
  Allocator *local_350;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  void **local_330;
  void **local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined4 local_30c;
  Allocator *local_308;
  undefined8 *local_300;
  Allocator *local_2f8;
  long *local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2c8;
  undefined4 local_2c4;
  Allocator *local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  undefined8 *local_280;
  undefined8 *local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  undefined8 *local_1d0;
  int local_198;
  undefined4 local_194;
  undefined8 *local_190;
  void *local_170;
  undefined8 *local_158;
  undefined8 local_150;
  undefined4 local_144;
  long local_140;
  undefined4 *local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  void *local_100;
  undefined8 *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  void *local_b0;
  void *local_68;
  void *local_58;
  _func_int **local_18;
  
  _c_00 = (int)((ulong)in_stack_fffffffffffff818 >> 0x20);
  if (*(int *)(in_RDI + 0x160) == 0) {
    local_480 = in_RSI;
    pLVar4 = create_activation_layer
                       (in_stack_fffffffffffff7c4,in_stack_fffffffffffff7b8,
                        in_stack_fffffffffffff7b0);
    *(Layer **)(in_RDI + 0x1f8) = pLVar4;
    local_484 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    uVar3 = (long)*(int *)(in_RDI + 0x110) / (long)local_484;
    local_488 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                     (long)*(int *)(in_RDI + 0xd0));
    local_48c = 1;
    local_490 = 1;
    if ((local_480[0x27] & 1) != 0) {
      if (local_488 % 8 == 0) {
        local_784 = 8;
      }
      else {
        local_784 = 1;
        if (local_488 % 4 == 0) {
          local_784 = 4;
        }
      }
      local_48c = local_784;
      if (*(int *)(in_RDI + 0xd0) % 8 == 0) {
        local_788 = 8;
      }
      else {
        local_788 = 1;
        if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
          local_788 = 4;
        }
      }
      local_490 = local_788;
    }
    if ((local_480[0x1d] & 1) == 0) {
      local_30c = *(undefined4 *)(in_RDI + 0x194);
      pAVar6 = &local_660;
      local_318 = 4;
      local_320 = 0;
      local_660._vptr_Allocator = (_func_int **)0x0;
      local_658 = (int *)0x0;
      local_650 = 0;
      local_648 = 0;
      local_640 = (long *)0x0;
      local_638 = 0;
      local_634 = 0;
      local_630 = 0;
      local_62c = 0;
      local_628 = 0;
      local_620 = 0;
      local_308 = pAVar6;
      Mat::create(in_stack_fffffffffffff720,in_stack_fffffffffffff71c,
                  CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                  in_stack_fffffffffffff708);
      _c = (int)((ulong)in_stack_fffffffffffff720 >> 0x20);
      local_2f8 = &local_660;
      local_668 = local_660._vptr_Allocator;
      local_2f0 = (long *)(in_RDI + 0x168);
      local_670 = *local_2f0;
      for (local_674 = 0; local_674 < local_488 * *(int *)(in_RDI + 0xd0); local_674 = local_674 + 1
          ) {
        for (local_678 = 0; local_678 < local_484; local_678 = local_678 + 1) {
          *(undefined4 *)((long)local_668 + (long)((local_484 + -1) - local_678) * 4) =
               *(undefined4 *)(local_670 + (long)local_678 * 4);
        }
        local_670 = local_670 + (long)local_484 * 4;
        local_668 = (_func_int **)((long)local_668 + (long)local_484 * 4);
      }
      Mat::reshape(in_stack_fffffffffffff828,(int)((ulong)in_stack_fffffffffffff820 >> 0x20),
                   (int)in_stack_fffffffffffff820,_c_00,in_stack_fffffffffffff810);
      Mat::create(in_stack_fffffffffffff730,(int)((ulong)in_stack_fffffffffffff728 >> 0x20),
                  (int)in_stack_fffffffffffff728,_c,
                  CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718),
                  in_stack_fffffffffffff714,pAVar6);
      for (local_6c4 = 0; local_6c4 + local_490 + -1 < *(int *)(in_RDI + 0xd0);
          local_6c4 = local_490 + local_6c4) {
        local_408 = (long *)(in_RDI + 0x208);
        local_40c = local_6c4 / local_490;
        local_400 = &local_718;
        local_124 = *(int *)(in_RDI + 0x234);
        local_128 = *(int *)(in_RDI + 0x238);
        local_12c = *(undefined4 *)(in_RDI + 0x23c);
        local_138 = (undefined4 *)
                    (*local_408 +
                    *(long *)(in_RDI + 0x248) * (long)local_40c * *(long *)(in_RDI + 0x218));
        local_140 = *(long *)(in_RDI + 0x218);
        local_144 = *(undefined4 *)(in_RDI + 0x220);
        local_150 = *(undefined8 *)(in_RDI + 0x228);
        local_120 = &local_718;
        local_c8 = (long)local_124 * (long)local_128 * local_140;
        local_300 = &local_718;
        local_380 = &local_718;
        local_cc = 0x10;
        local_40d = 1;
        local_718 = 0;
        local_708 = 0;
        local_700 = 0;
        local_6f0 = 0;
        local_6ec = 0;
        local_6e8 = 0;
        local_6e4 = 0;
        local_6e0 = 0;
        local_6d8 = 0;
        local_710 = 0;
        local_6d0 = local_138;
        for (local_71c = 0; local_71c + local_48c + -1 < local_488;
            local_71c = local_48c + local_71c) {
          for (local_720 = 0; local_720 < local_484; local_720 = local_720 + 1) {
            for (local_724 = 0; local_724 < local_48c; local_724 = local_724 + 1) {
              for (local_728 = 0; local_728 < local_490; local_728 = local_728 + 1) {
                local_424 = local_6c4 + local_728;
                local_418 = &local_778;
                local_420 = &local_6c0;
                local_100 = (void *)((long)local_6c0 + local_680 * local_424 * local_6b0);
                local_e8 = &local_778;
                local_d8 = (long)local_694 * (long)local_690 * local_6b0;
                local_454 = local_71c + local_724;
                local_450 = &local_778;
                local_730 = (void *)((long)local_100 + (long)local_694 * (long)local_454 * local_6b0
                                    );
                local_370 = &local_778;
                local_dc = 0x10;
                local_425 = 1;
                local_778 = 0;
                local_750 = 0;
                local_744 = 0;
                local_738 = 0;
                local_770 = 0;
                *local_6d0 = *(undefined4 *)((long)local_730 + (long)local_720 * 4);
                local_6d0 = local_6d0 + 1;
                local_280 = local_370;
              }
            }
          }
        }
        local_260 = local_380;
        local_6f8 = local_150;
      }
      ppvVar7 = &local_6c0;
      local_360 = ppvVar7;
      local_2a0 = ppvVar7;
      if (local_6b8 != (int *)0x0) {
        local_2a4 = 0xffffffff;
        LOCK();
        local_2a8 = *local_6b8;
        *local_6b8 = *local_6b8 + -1;
        UNLOCK();
        if (local_2a8 == 1) {
          if (local_6a0 == (long *)0x0) {
            if (local_6c0 != (void *)0x0) {
              free(local_6c0);
            }
          }
          else {
            (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
          }
        }
      }
      *ppvVar7 = (void *)0x0;
      ppvVar7[2] = (void *)0x0;
      *(undefined4 *)(ppvVar7 + 3) = 0;
      *(undefined4 *)(ppvVar7 + 5) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
      *(undefined4 *)(ppvVar7 + 6) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
      *(undefined4 *)(ppvVar7 + 7) = 0;
      ppvVar7[8] = (void *)0x0;
      ppvVar7[1] = (void *)0x0;
      pAVar6 = &local_660;
      local_350 = pAVar6;
      local_2c0 = pAVar6;
      if (local_658 != (int *)0x0) {
        local_2c4 = 0xffffffff;
        LOCK();
        local_2c8 = *local_658;
        *local_658 = *local_658 + -1;
        UNLOCK();
        if (local_2c8 == 1) {
          if (local_640 == (long *)0x0) {
            local_18 = local_660._vptr_Allocator;
            if (local_660._vptr_Allocator != (_func_int **)0x0) {
              free(local_660._vptr_Allocator);
            }
          }
          else {
            (**(code **)(*local_640 + 0x18))(local_640,local_660._vptr_Allocator);
          }
        }
      }
      pAVar6->_vptr_Allocator = (_func_int **)0x0;
      pAVar6[2]._vptr_Allocator = (_func_int **)0x0;
      *(undefined4 *)&pAVar6[3]._vptr_Allocator = 0;
      *(undefined4 *)&pAVar6[5]._vptr_Allocator = 0;
      *(undefined4 *)((long)&pAVar6[5]._vptr_Allocator + 4) = 0;
      *(undefined4 *)&pAVar6[6]._vptr_Allocator = 0;
      *(undefined4 *)((long)&pAVar6[6]._vptr_Allocator + 4) = 0;
      *(undefined4 *)&pAVar6[7]._vptr_Allocator = 0;
      pAVar6[8]._vptr_Allocator = (_func_int **)0x0;
      pAVar6[1]._vptr_Allocator = (_func_int **)0x0;
    }
    else {
      local_494 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
      pLVar4 = create_layer_cpu((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
      *(Layer **)(in_RDI + 0x200) = pLVar4;
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff720);
      ParamDict::set(&local_4a8,2,1);
      ParamDict::set(&local_4a8,3,0);
      ParamDict::set(&local_4a8,4,1);
      ParamDict::set(&local_4a8,5,0);
      ParamDict::set(&local_4a8,6,1);
      ParamDict::set(&local_4a8,7,local_494 * *(int *)(in_RDI + 0xd0));
      ParamDict::set(&local_4a8,8,0);
      ParamDict::set(&local_4a8,9,local_488);
      ParamDict::set(&local_4a8,10,-1);
      ParamDict::set(&local_4a8,0xb,0);
      ParamDict::set(&local_4a8,0xc,local_490);
      (**(code **)(**(long **)(in_RDI + 0x200) + 0x10))(*(long **)(in_RDI + 0x200),&local_4a8);
      local_468 = &local_500;
      local_500 = (void *)0x0;
      local_4f8 = (int *)0x0;
      local_4f0 = 0;
      local_4e8 = 0;
      local_4e0 = (long *)0x0;
      local_4d8 = 0;
      local_4d4 = 0;
      local_4d0 = 0;
      local_4cc = 0;
      local_4c8 = 0;
      local_4c0 = 0;
      Mat::reshape(in_stack_fffffffffffff828,(int)((ulong)in_stack_fffffffffffff820 >> 0x20),
                   (int)in_stack_fffffffffffff820,_c_00,in_stack_fffffffffffff810);
      Mat::create(in_stack_fffffffffffff720,in_stack_fffffffffffff71c,in_stack_fffffffffffff718,
                  CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                  in_stack_fffffffffffff708);
      for (local_54c = 0; local_54c < local_488; local_54c = local_54c + 1) {
        local_430 = &local_500;
        local_434 = local_54c;
        local_558 = (undefined4 *)((long)local_500 + (long)local_4d4 * (long)local_54c * local_4f0);
        for (local_55c = 0; local_55c + local_490 + -1 < *(int *)(in_RDI + 0xd0);
            local_55c = local_490 + local_55c) {
          for (local_560 = 0; local_560 < local_494; local_560 = local_560 + 1) {
            for (local_564 = 0; local_564 < local_490; local_564 = local_564 + 1) {
              local_3f4 = local_55c + local_564;
              local_3e8 = &local_5b8;
              local_3f0 = &local_548;
              local_170 = (void *)((long)local_548 + local_508 * local_3f4 * local_538);
              local_158 = &local_5b8;
              local_b8 = (long)local_51c * (long)local_518 * local_538;
              local_bc = 0x10;
              local_3f5 = 1;
              local_440 = &local_5b8;
              local_444 = local_54c;
              local_570 = (void *)((long)local_170 + (long)local_51c * (long)local_54c * local_538);
              local_3c8 = &local_5b8;
              local_5b8 = 0;
              local_5a8 = 0;
              local_5a0 = 0;
              local_590 = 0;
              local_58c = 0;
              local_588 = 0;
              local_584 = 0;
              local_580 = 0;
              local_578 = 0;
              local_5b0 = 0;
              *local_558 = *(undefined4 *)((long)local_570 + (long)local_560 * 4);
              local_558 = local_558 + 1;
              local_1d0 = local_3c8;
            }
          }
        }
      }
      local_3b8 = &local_548;
      local_1f0 = local_3b8;
      if (local_540 != (int *)0x0) {
        local_1f4 = 0xffffffff;
        LOCK();
        local_1f8 = *local_540;
        *local_540 = *local_540 + -1;
        UNLOCK();
        if (local_1f8 == 1) {
          if (local_528 == (long *)0x0) {
            if (local_548 != (void *)0x0) {
              free(local_548);
            }
          }
          else {
            (**(code **)(*local_528 + 0x18))(local_528,local_548);
          }
        }
      }
      local_548 = (void *)0x0;
      local_538 = 0;
      local_530 = 0;
      local_520 = 0;
      local_51c = 0;
      local_518 = 0;
      local_514 = 0;
      local_510 = 0;
      local_508 = 0;
      local_540 = (int *)0x0;
      ppvVar7 = &local_608;
      do {
        local_460 = ppvVar7;
        *ppvVar7 = (void *)0x0;
        ppvVar7[1] = (void *)0x0;
        ppvVar7[2] = (void *)0x0;
        *(undefined4 *)(ppvVar7 + 3) = 0;
        ppvVar7[4] = (void *)0x0;
        *(undefined4 *)(ppvVar7 + 5) = 0;
        *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
        *(undefined4 *)(ppvVar7 + 6) = 0;
        *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
        *(undefined4 *)(ppvVar7 + 7) = 0;
        ppvVar7[8] = (void *)0x0;
        ppvVar7 = ppvVar7 + 9;
      } while (ppvVar7 != &pvStack_5c0);
      local_338 = &local_500;
      local_330 = &local_608;
      if (&local_608 != local_338) {
        if (local_4f8 != (int *)0x0) {
          local_33c = 1;
          LOCK();
          local_340 = *local_4f8;
          *local_4f8 = *local_4f8 + 1;
          UNLOCK();
        }
        local_2e0 = &local_608;
        if (local_600 != (int *)0x0) {
          local_2e4 = 0xffffffff;
          LOCK();
          local_2e8 = *local_600;
          *local_600 = *local_600 + -1;
          UNLOCK();
          if (local_2e8 == 1) {
            if (local_5e8 == (long *)0x0) {
              if (local_608 != (void *)0x0) {
                free(local_608);
              }
            }
            else {
              (**(code **)(*local_5e8 + 0x18))(local_5e8,local_608);
            }
          }
        }
        local_608 = *local_338;
        local_600 = (int *)local_338[1];
        local_5f8 = local_338[2];
        local_5f0 = *(undefined4 *)(local_338 + 3);
        local_5e8 = (long *)local_338[4];
        local_5e0 = *(undefined4 *)(local_338 + 5);
        local_5dc = *(undefined4 *)((long)local_338 + 0x2c);
        local_5d8 = *(undefined4 *)(local_338 + 6);
        local_5d4 = *(undefined4 *)((long)local_338 + 0x34);
        local_5d0 = *(undefined4 *)(local_338 + 7);
        local_5c8 = local_338[8];
      }
      plVar1 = *(long **)(in_RDI + 0x200);
      local_328 = &local_608;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff720,
                 (Mat *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
      (**(code **)(*plVar1 + 0x18))(plVar1,local_618);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff700)
      ;
      (**(code **)(**(long **)(in_RDI + 0x200) + 0x20))(*(long **)(in_RDI + 0x200),local_480);
      local_810 = &pvStack_5c0;
      do {
        ppvVar7 = local_810 + -9;
        local_3a0 = ppvVar7;
        local_220 = ppvVar7;
        if (local_810[-8] != (void *)0x0) {
          piVar2 = (int *)local_810[-8];
          local_224 = 0xffffffff;
          LOCK();
          local_228 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (local_228 == 1) {
            if (local_810[-5] == (void *)0x0) {
              local_68 = *ppvVar7;
              if (local_68 != (void *)0x0) {
                free(local_68);
              }
            }
            else {
              (**(code **)(*local_810[-5] + 0x18))(local_810[-5],*ppvVar7);
            }
          }
        }
        *ppvVar7 = (void *)0x0;
        local_810[-7] = (void *)0x0;
        *(undefined4 *)(local_810 + -6) = 0;
        *(undefined4 *)(local_810 + -4) = 0;
        *(undefined4 *)((long)local_810 + -0x1c) = 0;
        *(undefined4 *)(local_810 + -3) = 0;
        *(undefined4 *)((long)local_810 + -0x14) = 0;
        *(undefined4 *)(local_810 + -2) = 0;
        local_810[-1] = (void *)0x0;
        local_810[-8] = (void *)0x0;
        local_810 = ppvVar7;
      } while (ppvVar7 != &local_608);
      local_390 = &local_500;
      local_240 = local_390;
      if (local_4f8 != (int *)0x0) {
        local_244 = 0xffffffff;
        LOCK();
        local_248 = *local_4f8;
        *local_4f8 = *local_4f8 + -1;
        UNLOCK();
        if (local_248 == 1) {
          if (local_4e0 == (long *)0x0) {
            local_58 = local_500;
            if (local_500 != (void *)0x0) {
              free(local_500);
            }
          }
          else {
            (**(code **)(*local_4e0 + 0x18))(local_4e0,local_500);
          }
        }
      }
      local_500 = (void *)0x0;
      local_4f0 = 0;
      local_4e8 = 0;
      local_4d8 = 0;
      local_4d4 = 0;
      local_4d0 = 0;
      local_4cc = 0;
      local_4c8 = 0;
      local_4c0 = 0;
      local_4f8 = (int *)0x0;
      ParamDict::~ParamDict(in_stack_fffffffffffff700);
    }
    if ((*local_480 & 1) != 0) {
      puVar5 = (undefined8 *)(in_RDI + 0x168);
      if (*(long *)(in_RDI + 0x170) != 0) {
        piVar2 = *(int **)(in_RDI + 0x170);
        local_194 = 0xffffffff;
        LOCK();
        local_198 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_198 == 1) {
          local_190 = puVar5;
          if (*(long *)(in_RDI + 0x188) == 0) {
            local_b0 = (void *)*puVar5;
            if (local_b0 != (void *)0x0) {
              free(local_b0);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*puVar5);
          }
        }
      }
      *puVar5 = 0;
      puVar5[2] = 0;
      *(undefined4 *)(puVar5 + 3) = 0;
      *(undefined4 *)(puVar5 + 5) = 0;
      *(undefined4 *)((long)puVar5 + 0x2c) = 0;
      *(undefined4 *)(puVar5 + 6) = 0;
      *(undefined4 *)((long)puVar5 + 0x34) = 0;
      *(undefined4 *)(puVar5 + 7) = 0;
      puVar5[8] = 0;
      puVar5[1] = 0;
    }
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}